

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O0

uintmax_t fs_file_size(string_view path)

{
  string_view path_00;
  bool bVar1;
  char *pcVar2;
  string_view local_80;
  error_category *local_70;
  char *local_68;
  path local_60;
  char *local_38;
  uintmax_t s;
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)&s);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  pcVar2 = (char *)std::filesystem::file_size(&local_60,(error_code *)&s);
  std::filesystem::__cxx11::path::~path(&local_60);
  local_38 = pcVar2;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&s);
  if (bVar1) {
    local_70 = ec._M_cat;
    local_68 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"fs_file_size");
    path_00._M_str = local_68;
    path_00._M_len = (size_t)local_70;
    fs_print_error(path_00,local_80,(error_code *)&s);
    path_local._M_str = (char *)0x0;
  }
  else {
    path_local._M_str = local_38;
  }
  return (uintmax_t)path_local._M_str;
}

Assistant:

std::uintmax_t fs_file_size(std::string_view path)
{
  std::error_code ec;
#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::file_size(path, ec); !ec)  FFS_LIKELY
    return s;
#elif defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getfilesizeex
  if (HANDLE h = CreateFileA(path.data(), GENERIC_READ, FILE_SHARE_READ, nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, nullptr);
      h != INVALID_HANDLE_VALUE)
  {
    LARGE_INTEGER size;
    BOOL ok = GetFileSizeEx(h, &size);

    if (CloseHandle(h) && ok)  FFS_LIKELY
      return size.QuadPart;
  } else {
    ec = std::make_error_code(std::errc::no_such_file_or_directory);
  }
#else

  int r = 0;
#if defined(STATX_SIZE) && defined(USE_STATX)
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_SIZE, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_size;
#endif

  if (r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_size;
  }

#endif

  fs_print_error(path, __func__, ec);
  return {};
}